

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O2

void Vec_PtrReverseOrder(Vec_Ptr_t *p)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = p->nSize;
  iVar3 = iVar4 / 2;
  for (lVar5 = 0; iVar4 = iVar4 + -1, lVar5 < iVar3; lVar5 = lVar5 + 1) {
    ppvVar1 = p->pArray;
    pvVar2 = ppvVar1[lVar5];
    ppvVar1[lVar5] = ppvVar1[iVar4];
    p->pArray[iVar4] = pvVar2;
  }
  return;
}

Assistant:

static inline void Vec_PtrReverseOrder( Vec_Ptr_t * p )
{
    void * Temp;
    int i;
    for ( i = 0; i < p->nSize/2; i++ )
    {
        Temp = p->pArray[i];
        p->pArray[i] = p->pArray[p->nSize-1-i];
        p->pArray[p->nSize-1-i] = Temp;
    }
}